

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private.hpp
# Opt level: O0

void baryonyx::info<std::basic_string_view<char,std::char_traits<char>>,bool,std::__cxx11::string>
               (context *ctx,char *fmt,basic_string_view<char,_std::char_traits<char>_> *arg1,
               bool *args,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_1;
  bool *args_local;
  basic_string_view<char,_std::char_traits<char>_> *arg1_local;
  char *fmt_local;
  context *ctx_local;
  
  bVar1 = is_loggable(ctx->log_priority,6);
  if (bVar1) {
    log<std::basic_string_view<char,std::char_traits<char>>,bool,std::__cxx11::string>
              (_stdout,6,fmt,arg1,args,args_1);
  }
  return;
}

Assistant:

void
info(const context& ctx,
     const char* fmt,
     const Arg1& arg1,
     const Args&... args)
{
#ifdef BARYONYX_ENABLE_LOG
    if (!is_loggable(ctx.log_priority, 6))
        return;

    log(stdout, 6, fmt, arg1, args...);
#else
    detail::sink(ctx, fmt, arg1, args...);
#endif
}